

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O1

void __thiscall TxRequestTracker::Impl::SanityCheck(Impl *this)

{
  _Link_type __s2;
  long *__args;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar1;
  pointer poVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  __node_base _Var6;
  _Base_ptr p_Var7;
  undefined1 auVar8 [16];
  type tVar9;
  uint uVar10;
  int iVar11;
  mapped_type *pmVar12;
  _Base_ptr this_00;
  _Base_ptr p_Var13;
  Priority PVar14;
  _Base_ptr p_Var15;
  _Base_ptr *pp_Var16;
  ulong uVar17;
  _Base_ptr p_Var18;
  iterator __position;
  _Link_type p_Var19;
  long lVar20;
  _Hash_node_base *p_Var21;
  _Link_type p_Var22;
  Announcement *ann;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar23;
  _Base_ptr p_Var24;
  _Rb_tree_node_base *p_Var25;
  Announcement *ann_1;
  long in_FS_OFFSET;
  bool bVar26;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar27;
  map<uint256,_(anonymous_namespace)::TxHashInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
  ret;
  ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *local_78;
  undefined1 local_70 [16];
  __node_base local_60;
  _Base_ptr p_Stack_58;
  _Base_ptr local_50;
  size_t local_48;
  __node_base_ptr p_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70._8_8_ = 1;
  local_60._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_58 = (_Base_ptr)0x0;
  local_50 = (_Base_ptr)CONCAT44(local_50._4_4_,1.0);
  local_48 = 0;
  p_Stack_40 = (__node_base_ptr)0x0;
  poVar1 = (this->m_index).
           super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
           .member;
  poVar2 = (poVar1->
           super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           ).
           super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .
           super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .super_type.left_;
  poVar23 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
             *)&poVar2[-5].
                super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                .super_type.right_;
  if (poVar2 == (pointer)0x0) {
    poVar23 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
               *)0x0;
  }
  local_70._0_8_ = &p_Stack_40;
  if (poVar23 != poVar1) {
    do {
      pmVar12 = std::
                unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
                ::operator[]((unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
                              *)local_70,
                             (key_type *)
                             ((poVar23->
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                              ).
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                              .
                              super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                              .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                              data_.buf + 0x28));
      pmVar12->m_total = pmVar12->m_total + 1;
      pmVar12->m_requested =
           pmVar12->m_requested +
           (ulong)((*(ulong *)((long)&(poVar23->
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                      ).
                                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                      .
                                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                      space.data_ + 0x30) & 0xe000000000000000) ==
                  0x6000000000000000);
      pmVar12->m_completed = pmVar12->m_completed;
      local_78 = &poVar23->
                  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
      ;
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::increment((pointer *)&local_78);
      poVar23 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 *)((long)(local_78 + -5) + 0x10);
      if (local_78 ==
          (ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           *)0x0) {
        poVar23 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                   *)0x0;
      }
    } while (poVar23 != poVar1);
  }
  if ((_Base_ptr)(this->m_peerinfo)._M_h._M_element_count == p_Stack_58) {
    p_Var3 = (this->m_peerinfo)._M_h._M_before_begin._M_nxt;
    bVar26 = p_Var3 == (_Hash_node_base *)0x0;
    if (bVar26) {
LAB_00af8b3b:
      _Var6._M_nxt = local_60._M_nxt;
      if (bVar26) {
        while (_Var6._M_nxt != (_Hash_node_base *)0x0) {
          p_Var3 = (_Var6._M_nxt)->_M_nxt;
          operator_delete(_Var6._M_nxt,0x28);
          _Var6._M_nxt = p_Var3;
        }
        __position._M_current = (long *)0x0;
        memset((void *)local_70._0_8_,0,local_70._8_8_ << 3);
        local_60._M_nxt = (_Hash_node_base *)0x0;
        p_Stack_58 = (_Base_ptr)0x0;
        if (&p_Stack_40 != (__node_base_ptr *)local_70._0_8_) {
          __position._M_current = (long *)(local_70._8_8_ << 3);
          operator_delete((void *)local_70._0_8_,(ulong)__position._M_current);
        }
        p_Stack_58 = (_Base_ptr)(local_70 + 8);
        local_70._8_8_ = local_70._8_8_ & 0xffffffff00000000;
        local_60._M_nxt = (_Hash_node_base *)0x0;
        local_48 = 0;
        poVar1 = (this->m_index).
                 super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                 .member;
        poVar2 = (poVar1->
                 super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 ).
                 super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                 .
                 super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                 .super_type.left_;
        poVar23 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                   *)&poVar2[-5].
                      super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                      .super_type.right_;
        if (poVar2 == (pointer)0x0) {
          poVar23 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                     *)0x0;
        }
        local_50 = p_Stack_58;
        if (poVar23 != poVar1) {
          do {
            p_Var13 = (_Base_ptr)(local_70 + 8);
            p_Var15 = p_Var13;
            for (_Var6._M_nxt = local_60._M_nxt; (_Base_ptr)_Var6._M_nxt != (_Base_ptr)0x0;
                _Var6._M_nxt = (_Hash_node_base *)
                               (&((_Base_ptr)_Var6._M_nxt)->_M_left)[uVar10 >> 0x1f]) {
              uVar10 = memcmp((_Base_ptr)((long)_Var6._M_nxt + 0x20),poVar23,0x20);
              if (-1 < (int)uVar10) {
                p_Var15 = (_Base_ptr)_Var6._M_nxt;
              }
            }
            if ((p_Var15 == p_Var13) || (iVar11 = memcmp(poVar23,p_Var15 + 1,0x20), iVar11 < 0)) {
              this_00 = (_Base_ptr)operator_new(0x88);
              p_Var24 = local_50;
              p_Var22 = (_Link_type)(this_00 + 1);
              tVar9 = (poVar23->
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                      ).
                      super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                      .
                      super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                      .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_.
                      align_;
              p_Var7 = *(_Base_ptr *)
                        ((long)&(poVar23->
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                ).
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                .
                                super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                                data_ + 8);
              p_Var18 = *(_Base_ptr *)
                         ((long)&(poVar23->
                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                 ).
                                 super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                 .
                                 super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                 .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                                 data_ + 0x18);
              this_00[1]._M_left =
                   *(_Base_ptr *)
                    ((long)&(poVar23->
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                            ).
                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                            .
                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                            .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.data_
                    + 0x10);
              this_00[1]._M_right = p_Var18;
              *(type *)(this_00 + 1) = tVar9;
              this_00[1]._M_parent = p_Var7;
              *(undefined8 *)(this_00 + 3) = 0;
              this_00[3]._M_parent = (_Base_ptr)0x0;
              this_00[3]._M_left = (_Base_ptr)0x0;
              this_00[3]._M_right = (_Base_ptr)0x0;
              *(undefined8 *)(this_00 + 2) = 0;
              this_00[2]._M_parent = (_Base_ptr)0x0;
              this_00[2]._M_left = (_Base_ptr)0x0;
              this_00[2]._M_right = (_Base_ptr)0x0;
              *(undefined8 *)(this_00 + 4) = 0;
              *(undefined8 *)(this_00 + 3) = 0xffffffffffffffff;
              this_00[3]._M_parent = (_Base_ptr)0x0;
              this_00[3]._M_left = (_Base_ptr)0x0;
              this_00[3]._M_right = (_Base_ptr)0x0;
              *(undefined8 *)(this_00 + 4) = 0;
              if (p_Var15 == p_Var13) {
                if ((local_48 == 0) ||
                   (p_Var19 = p_Var22, iVar11 = memcmp(local_50 + 1,p_Var22,0x20), -1 < iVar11)) {
LAB_00af8d70:
                  p_Var19 = p_Var22;
                  pVar27 = std::
                           _Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                           ::_M_get_insert_unique_pos
                                     ((_Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                                       *)local_70,(key_type *)p_Var22);
                }
                else {
LAB_00af8d85:
                  auVar8._8_8_ = 0;
                  auVar8._0_8_ = p_Var24;
                  pVar27 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)
                           (auVar8 << 0x40);
                }
              }
              else {
                __s2 = (_Link_type)(p_Var15 + 1);
                p_Var19 = __s2;
                iVar11 = memcmp(p_Var22,__s2,0x20);
                if (iVar11 < 0) {
                  pVar27.second = p_Stack_58;
                  pVar27.first = p_Stack_58;
                  if (p_Stack_58 != p_Var15) {
                    p_Var13 = (_Base_ptr)std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var15);
                    p_Var19 = p_Var22;
                    iVar11 = memcmp(p_Var13 + 1,p_Var22,0x20);
                    if (-1 < iVar11) goto LAB_00af8d70;
                    p_Var7 = p_Var15;
                    if (p_Var13->_M_right == (_Base_ptr)0x0) {
                      p_Var15 = p_Var13;
                      p_Var7 = (_Base_ptr)0x0;
                    }
                    pVar27.second = p_Var15;
                    pVar27.first = p_Var7;
                  }
                }
                else {
                  p_Var19 = p_Var22;
                  iVar11 = memcmp(__s2,p_Var22,0x20);
                  if (iVar11 < 0) {
                    p_Var24 = local_50;
                    if (local_50 == p_Var15) goto LAB_00af8d85;
                    p_Var13 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var15);
                    p_Var19 = (_Link_type)(p_Var13 + 1);
                    iVar11 = memcmp(p_Var22,p_Var19,0x20);
                    if (-1 < iVar11) goto LAB_00af8d70;
                    p_Var7 = p_Var13;
                    if (p_Var15->_M_right == (_Base_ptr)0x0) {
                      p_Var13 = p_Var15;
                      p_Var7 = (_Base_ptr)0x0;
                    }
                    pVar27.second = p_Var13;
                    pVar27.first = p_Var7;
                  }
                  else {
                    pVar27.second = (_Rb_tree_node_base *)0x0;
                    pVar27.first = p_Var15;
                  }
                }
              }
              p_Var25 = pVar27.second;
              p_Var15 = pVar27.first;
              if (p_Var25 == (_Rb_tree_node_base *)0x0) {
                std::
                _Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                ::_M_drop_node((_Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                                *)this_00,p_Var19);
              }
              else {
                bVar26 = true;
                if ((p_Var15 == (_Base_ptr)0x0) && ((_Rb_tree_node_base *)(local_70 + 8) != p_Var25)
                   ) {
                  iVar11 = memcmp(p_Var22,p_Var25 + 1,0x20);
                  bVar26 = SUB41((uint)iVar11 >> 0x1f,0);
                }
                std::_Rb_tree_insert_and_rebalance
                          (bVar26,(_Rb_tree_node_base *)this_00,(_Rb_tree_node_base *)p_Var25,
                           (_Rb_tree_node_base *)(local_70 + 8));
                local_48 = local_48 + 1;
                p_Var15 = this_00;
              }
            }
            *(ulong *)(p_Var15 + 2) =
                 *(long *)(p_Var15 + 2) +
                 (ulong)(*(ulong *)((long)&(poVar23->
                                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                           ).
                                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                           .
                                           super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                           .
                                           super_pod_value_holder<(anonymous_namespace)::Announcement>
                                           .space.data_ + 0x30) < 0x2000000000000000);
            p_Var15[2]._M_parent =
                 (_Base_ptr)
                 ((long)&(p_Var15[2]._M_parent)->_M_color +
                 (ulong)((*(ulong *)((long)&(poVar23->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                            ).
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            .
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x30) & 0xe000000000000000) ==
                        0x2000000000000000));
            p_Var15[2]._M_left =
                 (_Base_ptr)
                 ((long)&(p_Var15[2]._M_left)->_M_color +
                 (ulong)((*(ulong *)((long)&(poVar23->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                            ).
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            .
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x30) & 0xe000000000000000) ==
                        0x4000000000000000));
            p_Var15[2]._M_right =
                 (_Base_ptr)
                 ((long)&(p_Var15[2]._M_right)->_M_color +
                 (ulong)((*(ulong *)((long)&(poVar23->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                            ).
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            .
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x30) & 0xe000000000000000) ==
                        0x6000000000000000));
            uVar17 = *(ulong *)((long)&(poVar23->
                                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                       ).
                                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                       .
                                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                       space.data_ + 0x30);
            if ((uVar17 & 0xe000000000000000) == 0x4000000000000000) {
              PVar14 = anon_unknown.dwarf_3e97f47::PriorityComputer::operator()
                                 (&this->m_computer,(uint256 *)poVar23,
                                  *(NodeId *)
                                   ((long)&(poVar23->
                                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                           ).
                                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                           .
                                           super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                           .
                                           super_pod_value_holder<(anonymous_namespace)::Announcement>
                                           .space.data_ + 0x28),(uVar17 & 0x800000000000000) != 0);
              *(Priority *)(p_Var15 + 3) = PVar14;
            }
            uVar17 = *(ulong *)((long)&(poVar23->
                                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                       ).
                                       super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                       .
                                       super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                       .super_pod_value_holder<(anonymous_namespace)::Announcement>.
                                       space.data_ + 0x30);
            if ((uVar17 & 0xe000000000000000) == 0x2000000000000000) {
              p_Var13 = (_Base_ptr)
                        anon_unknown.dwarf_3e97f47::PriorityComputer::operator()
                                  (&this->m_computer,(uint256 *)poVar23,
                                   *(NodeId *)
                                    ((long)&(poVar23->
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                                            ).
                                            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                                            .
                                            super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                                            .
                                            super_pod_value_holder<(anonymous_namespace)::Announcement>
                                            .space.data_ + 0x28),(uVar17 & 0x800000000000000) != 0);
              if (p_Var13 < p_Var15[3]._M_parent) {
                p_Var13 = p_Var15[3]._M_parent;
              }
              p_Var15[3]._M_parent = p_Var13;
            }
            __args = (long *)((poVar23->
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                              ).
                              super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
                              .
                              super_index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>
                              .super_pod_value_holder<(anonymous_namespace)::Announcement>.space.
                              data_.buf + 0x28);
            __position._M_current = (long *)p_Var15[3]._M_right;
            if (__position._M_current == *(long **)(p_Var15 + 4)) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)&p_Var15[3]._M_left,__position,__args)
              ;
            }
            else {
              *__position._M_current = *__args;
              __position._M_current = __position._M_current + 1;
              p_Var15[3]._M_right = (_Base_ptr)__position._M_current;
            }
            local_78 = &poVar23->
                        super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
            ;
            boost::multi_index::detail::
            ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
            ::increment((pointer *)&local_78);
            poVar23 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                       *)((long)(local_78 + -5) + 0x10);
            if (local_78 ==
                (ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 *)0x0) {
              poVar23 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                         *)0x0;
            }
          } while (poVar23 != poVar1);
        }
        p_Var15 = p_Stack_58;
        do {
          if (p_Var15 == (_Base_ptr)(local_70 + 8)) {
            std::
            _Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
            ::_M_erase((_Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                        *)local_60._M_nxt,(_Link_type)__position._M_current);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              return;
            }
            __stack_chk_fail();
          }
          p_Var13 = p_Var15[2]._M_parent;
          p_Var7 = p_Var15[2]._M_left;
          lVar20 = (long)&(p_Var15[2]._M_right)->_M_color +
                   (long)&p_Var7->_M_color + (long)&p_Var13->_M_color + *(long *)(p_Var15 + 2);
          if (lVar20 == 0) {
            __assert_fail("info.m_candidate_delayed + info.m_candidate_ready + info.m_candidate_best + info.m_requested > 0"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                          ,0x150,"void TxRequestTracker::Impl::SanityCheck() const");
          }
          uVar17 = (long)&p_Var7->_M_color + (long)&(p_Var15[2]._M_right)->_M_color;
          if (1 < uVar17) {
            __assert_fail("info.m_candidate_best + info.m_requested <= 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                          ,0x153,"void TxRequestTracker::Impl::SanityCheck() const");
          }
          if (uVar17 != 1 && p_Var13 != (_Base_ptr)0x0) {
            __assert_fail("info.m_candidate_best + info.m_requested == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                          ,0x158,"void TxRequestTracker::Impl::SanityCheck() const");
          }
          if ((p_Var7 != (_Base_ptr)0x0 && p_Var13 != (_Base_ptr)0x0) &&
             (*(_Base_ptr *)(p_Var15 + 3) < p_Var15[3]._M_parent)) {
            __assert_fail("info.m_priority_candidate_best >= info.m_priority_best_candidate_ready",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                          ,0x15e,"void TxRequestTracker::Impl::SanityCheck() const");
          }
          p_Var22 = (_Link_type)p_Var15[3]._M_left;
          p_Var19 = (_Link_type)p_Var15[3]._M_right;
          __position._M_current =
               (long *)CONCAT71((int7)((ulong)lVar20 >> 8),p_Var13 == (_Base_ptr)0x0);
          if (p_Var22 != p_Var19) {
            uVar17 = (long)p_Var19 - (long)p_Var22 >> 3;
            lVar20 = 0x3f;
            if (uVar17 != 0) {
              for (; uVar17 >> lVar20 == 0; lVar20 = lVar20 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (p_Var22,p_Var19,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (p_Var22);
            __position._M_current = (long *)p_Var19;
          }
          p_Var13 = p_Var15[3]._M_left;
          p_Var7 = p_Var15[3]._M_right;
          p_Var18 = p_Var7;
          if (p_Var13 != p_Var7) {
            do {
              pp_Var16 = &p_Var13->_M_parent;
              p_Var18 = p_Var7;
              if ((_Base_ptr)pp_Var16 == p_Var7) break;
              __position._M_current = *(long **)p_Var13;
              p_Var18 = p_Var13;
              p_Var13 = (_Base_ptr)pp_Var16;
            } while ((_Link_type)__position._M_current != (_Link_type)*pp_Var16);
          }
          if (p_Var18 != p_Var7) {
            __assert_fail("std::adjacent_find(info.m_peers.begin(), info.m_peers.end()) == info.m_peers.end()"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                          ,0x163,"void TxRequestTracker::Impl::SanityCheck() const");
          }
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var15);
        } while( true );
      }
    }
    else {
      p_Var4 = p_Var3[1]._M_nxt;
      uVar17 = (ulong)p_Var4 % (ulong)local_70._8_8_;
      p_Var5 = *(__node_base_ptr *)(local_70._0_8_ + uVar17 * 8);
      while (p_Var5 != (__node_base_ptr)0x0) {
        p_Var21 = p_Var5->_M_nxt;
        while( true ) {
          if (((p_Var21[1]._M_nxt == p_Var4) && (p_Var21[2]._M_nxt == p_Var3[2]._M_nxt)) &&
             (p_Var21[3]._M_nxt == p_Var3[3]._M_nxt)) {
            bVar26 = p_Var21[4]._M_nxt == p_Var3[4]._M_nxt;
          }
          else {
            bVar26 = false;
          }
          if (bVar26) break;
          p_Var21 = p_Var21->_M_nxt;
          if ((p_Var21 == (_Hash_node_base *)0x0) ||
             ((ulong)p_Var21[1]._M_nxt % (ulong)local_70._8_8_ != uVar17)) goto LAB_00af8b1c;
        }
        p_Var3 = p_Var3->_M_nxt;
        bVar26 = p_Var3 == (_Hash_node_base *)0x0;
        if (bVar26) goto LAB_00af8b3b;
        p_Var4 = p_Var3[1]._M_nxt;
        uVar17 = (ulong)p_Var4 % (ulong)local_70._8_8_;
        p_Var5 = *(__node_base_ptr *)(local_70._0_8_ + uVar17 * 8);
      }
    }
  }
LAB_00af8b1c:
  __assert_fail("m_peerinfo == RecomputePeerInfo(m_index)",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                ,0x149,"void TxRequestTracker::Impl::SanityCheck() const");
}

Assistant:

void SanityCheck() const
    {
        // Recompute m_peerdata from m_index. This verifies the data in it as it should just be caching statistics
        // on m_index. It also verifies the invariant that no PeerInfo announcements with m_total==0 exist.
        assert(m_peerinfo == RecomputePeerInfo(m_index));

        // Calculate per-txhash statistics from m_index, and validate invariants.
        for (auto& item : ComputeTxHashInfo(m_index, m_computer)) {
            TxHashInfo& info = item.second;

            // Cannot have only COMPLETED peer (txhash should have been forgotten already)
            assert(info.m_candidate_delayed + info.m_candidate_ready + info.m_candidate_best + info.m_requested > 0);

            // Can have at most 1 CANDIDATE_BEST/REQUESTED peer
            assert(info.m_candidate_best + info.m_requested <= 1);

            // If there are any CANDIDATE_READY announcements, there must be exactly one CANDIDATE_BEST or REQUESTED
            // announcement.
            if (info.m_candidate_ready > 0) {
                assert(info.m_candidate_best + info.m_requested == 1);
            }

            // If there is both a CANDIDATE_READY and a CANDIDATE_BEST announcement, the CANDIDATE_BEST one must be
            // at least as good (equal or higher priority) as the best CANDIDATE_READY.
            if (info.m_candidate_ready && info.m_candidate_best) {
                assert(info.m_priority_candidate_best >= info.m_priority_best_candidate_ready);
            }

            // No txhash can have been announced by the same peer twice.
            std::sort(info.m_peers.begin(), info.m_peers.end());
            assert(std::adjacent_find(info.m_peers.begin(), info.m_peers.end()) == info.m_peers.end());
        }
    }